

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O1

void test_unicode_escape_sequence_in_identifier(void)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer ptVar2;
  version vVar3;
  wostream *pwVar4;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar5;
  token *ptVar6;
  token *ptVar7;
  bool bVar8;
  initializer_list<mjs::token> __l;
  initializer_list<mjs::token> __l_00;
  initializer_list<mjs::token> __l_01;
  vector<mjs::token,_std::allocator<mjs::token>_> _r;
  vector<mjs::token,_std::allocator<mjs::token>_> _l;
  allocator_type local_199;
  vector<mjs::token,_std::allocator<mjs::token>_> local_198;
  vector<mjs::token,_std::allocator<mjs::token>_> local_180;
  wstring local_168;
  undefined1 local_148 [40];
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_148._0_8_ = 0xc;
  local_148._8_8_ = L"\\u0069\\u0066";
  check_lex_fails_abi_cxx11_(&local_40,(wstring_view *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_148._0_8_ = 0xc;
  local_148._8_8_ = L"\\u0069\\u0000";
  check_lex_fails_abi_cxx11_(&local_60,(wstring_view *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_148._0_8_ = 10;
  local_148._8_8_ = L"\\u0069\\u00";
  check_lex_fails_abi_cxx11_(&local_80,(wstring_view *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_148._0_8_ = 9;
  local_148._8_8_ = L"\\u0069\\u0";
  check_lex_fails_abi_cxx11_(&local_a0,(wstring_view *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_148._0_8_ = 8;
  local_148._8_8_ = L"\\u0069\\u";
  check_lex_fails_abi_cxx11_(&local_c0,(wstring_view *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_148._0_8_ = 7;
  local_148._8_8_ = L"\\u0069\\";
  check_lex_fails_abi_cxx11_(&local_e0,(wstring_view *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_148._0_8_ = 10;
  local_148._8_8_ = L"\\u0069\\x66";
  check_lex_fails_abi_cxx11_(&local_100,(wstring_view *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  vVar3 = tested_version();
  if (vVar3 == es1) {
    local_148._0_8_ = 0xe;
    local_148._8_8_ = L"\\u0073X\\u0031d";
    check_lex_fails_abi_cxx11_(&local_120,(wstring_view *)local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_148._0_8_ = 6;
  local_148._8_8_ = L"\\u0069";
  lex(&local_180,(wstring_view *)local_148);
  paVar1 = &local_168.field_2;
  local_168._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_168,L"i",L"");
  mjs::token::token((token *)local_148,identifier,&local_168);
  __l._M_len = 1;
  __l._M_array = (iterator)local_148;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector(&local_198,__l,&local_199);
  mjs::token::destroy((token *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_168._M_dataplus._M_p != paVar1) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity * 4 + 4);
  }
  ptVar2 = local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar6 = local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar7 = local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
            super__Vector_impl_data._M_start) {
    bVar8 = local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar8) {
LAB_00118e77:
      if (bVar8) {
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&local_198);
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&local_180);
        local_148._0_8_ = 0xe;
        local_148._8_8_ = L"\\u0073X\\u0031d";
        lex(&local_180,(wstring_view *)local_148);
        local_168._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_168,L"sX1d",L"");
        mjs::token::token((token *)local_148,identifier,&local_168);
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_148;
        std::vector<mjs::token,_std::allocator<mjs::token>_>::vector(&local_198,__l_00,&local_199);
        mjs::token::destroy((token *)local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        ptVar2 = local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        ptVar6 = local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ptVar7 = local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                  super__Vector_impl_data._M_start ==
            (long)local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                  super__Vector_impl_data._M_start) {
          bVar8 = local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                  super__Vector_impl_data._M_finish;
          if (bVar8) {
LAB_00119080:
            if (bVar8) {
              std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&local_198);
              std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&local_180);
              local_148._0_8_ = 7;
              local_148._8_8_ = L"\\u1234申";
              lex(&local_180,(wstring_view *)local_148);
              local_168._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::wstring::_M_construct<wchar_t_const*>
                        ((wstring *)&local_168,L"ሴ申",L"");
              mjs::token::token((token *)local_148,identifier,&local_168);
              __l_01._M_len = 1;
              __l_01._M_array = (iterator)local_148;
              std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                        (&local_198,__l_01,&local_199);
              mjs::token::destroy((token *)local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_168._M_dataplus._M_p != paVar1) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity * 4 + 4);
              }
              if ((long)local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                  (long)local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
                bVar8 = local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                        local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
                if (bVar8) {
LAB_00119289:
                  if (bVar8) {
                    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&local_198);
                    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&local_180);
                    return;
                  }
                }
                else {
                  bVar8 = mjs::operator==(local_180.
                                          super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          local_198.
                                          super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  if (bVar8) {
                    do {
                      ptVar6 = local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1;
                      bVar8 = ptVar6 == local_180.
                                        super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                                        _M_impl.super__Vector_impl_data._M_finish;
                      if (bVar8) goto LAB_00119289;
                      bVar8 = mjs::operator==(ptVar6,local_198.
                                                                                                          
                                                  super__Vector_base<mjs::token,_std::allocator<mjs::token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                      local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                      super__Vector_impl_data._M_start = ptVar6;
                      local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1;
                    } while (bVar8);
                  }
                }
              }
              pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                       "test_unicode_escape_sequence_in_identifier");
              pwVar4 = std::operator<<(pwVar4," in ");
              pwVar4 = std::operator<<(pwVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                      );
              pwVar4 = std::operator<<(pwVar4,":");
              pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0xde);
              pwVar4 = std::operator<<(pwVar4,":\n");
              pwVar4 = std::operator<<(pwVar4,"lex(L\"\\\\u1234\\x7533\")");
              pwVar4 = std::operator<<(pwVar4," != ");
              pwVar4 = std::operator<<(pwVar4,
                                       "TOKENS(token{token_type::identifier, L\"\\x1234\\x7533\"})")
              ;
              pwVar4 = std::operator<<(pwVar4,"\n");
              pbVar5 = operator<<(pwVar4,&local_180);
              pwVar4 = std::operator<<(pbVar5," != ");
              pbVar5 = operator<<(pwVar4,&local_198);
              pwVar4 = std::operator<<(pbVar5,"\n");
              vVar3 = tested_version();
              pbVar5 = mjs::operator<<(pwVar4,vVar3);
              std::operator<<(pbVar5,"\n");
              goto LAB_00119284;
            }
          }
          else {
            bVar8 = mjs::operator==(local_180.
                                    super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    local_198.
                                    super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            if (bVar8) {
              do {
                ptVar7 = ptVar7 + 1;
                ptVar6 = ptVar6 + 1;
                bVar8 = ptVar6 == ptVar2;
                if (bVar8) goto LAB_00119080;
                bVar8 = mjs::operator==(ptVar6,ptVar7);
              } while (bVar8);
            }
          }
        }
        pwVar4 = std::operator<<((wostream *)&std::wcerr,
                                 "test_unicode_escape_sequence_in_identifier");
        pwVar4 = std::operator<<(pwVar4," in ");
        pwVar4 = std::operator<<(pwVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                );
        pwVar4 = std::operator<<(pwVar4,":");
        pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0xdd);
        pwVar4 = std::operator<<(pwVar4,":\n");
        pwVar4 = std::operator<<(pwVar4,"lex(uid)");
        pwVar4 = std::operator<<(pwVar4," != ");
        pwVar4 = std::operator<<(pwVar4,"TOKENS(token{token_type::identifier, L\"sX1d\"})");
        pwVar4 = std::operator<<(pwVar4,"\n");
        pbVar5 = operator<<(pwVar4,&local_180);
        pwVar4 = std::operator<<(pbVar5," != ");
        pbVar5 = operator<<(pwVar4,&local_198);
        pwVar4 = std::operator<<(pbVar5,"\n");
        vVar3 = tested_version();
        pbVar5 = mjs::operator<<(pwVar4,vVar3);
        std::operator<<(pbVar5,"\n");
        goto LAB_00119284;
      }
    }
    else {
      bVar8 = mjs::operator==(local_180.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              local_198.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      if (bVar8) {
        do {
          ptVar7 = ptVar7 + 1;
          ptVar6 = ptVar6 + 1;
          bVar8 = ptVar6 == ptVar2;
          if (bVar8) goto LAB_00118e77;
          bVar8 = mjs::operator==(ptVar6,ptVar7);
        } while (bVar8);
      }
    }
  }
  pwVar4 = std::operator<<((wostream *)&std::wcerr,"test_unicode_escape_sequence_in_identifier");
  pwVar4 = std::operator<<(pwVar4," in ");
  pwVar4 = std::operator<<(pwVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                          );
  pwVar4 = std::operator<<(pwVar4,":");
  pwVar4 = (wostream *)std::wostream::operator<<((wostream *)pwVar4,0xdc);
  pwVar4 = std::operator<<(pwVar4,":\n");
  pwVar4 = std::operator<<(pwVar4,"lex(LR\"(\\u0069)\")");
  pwVar4 = std::operator<<(pwVar4," != ");
  pwVar4 = std::operator<<(pwVar4,"TOKENS(token{token_type::identifier, L\"i\"})");
  pwVar4 = std::operator<<(pwVar4,"\n");
  pbVar5 = operator<<(pwVar4,&local_180);
  pwVar4 = std::operator<<(pbVar5," != ");
  pbVar5 = operator<<(pwVar4,&local_198);
  pwVar4 = std::operator<<(pbVar5,"\n");
  vVar3 = tested_version();
  pbVar5 = mjs::operator<<(pwVar4,vVar3);
  std::operator<<(pbVar5,"\n");
LAB_00119284:
  abort();
}

Assistant:

void test_unicode_escape_sequence_in_identifier() {
    check_lex_fails(LR"(\u0069\u0066)"); // Must not spell 'if' like this
    check_lex_fails(LR"(\u0069\u0000)");
    check_lex_fails(LR"(\u0069\u00)");
    check_lex_fails(LR"(\u0069\u0)");
    check_lex_fails(LR"(\u0069\u)");
    check_lex_fails(LR"(\u0069\)");
    check_lex_fails(LR"(\u0069\x66)");

    const auto uid = LR"(\u0073X\u0031d)";
    if (tested_version() == version::es1) {
        check_lex_fails(uid);
    } else {
        SIMPLE_TEST(LR"(\u0069)", ID("i"));
        SIMPLE_TEST(uid, ID("sX1d"));
        SIMPLE_TEST(L"\\u1234\x7533", ID("\x1234\x7533"));
    }
}